

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O1

bool xercesc_4_0::XMLUri::isWellFormedAddress(XMLCh *addrString,MemoryManager *manager)

{
  ulong length;
  short *psVar1;
  XMLCh XVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  long lVar7;
  uint uVar8;
  XMLSize_t toSearchLen;
  ulong uVar9;
  ulong uVar10;
  XMLCh *targetStr;
  
  if ((addrString != (XMLCh *)0x0) && (XVar2 = *addrString, XVar2 != L'\0')) {
    lVar7 = 0;
    do {
      psVar1 = (short *)((long)addrString + lVar7);
      lVar7 = lVar7 + 2;
    } while (*psVar1 != 0);
    if (1 < (ushort)XVar2 - 0x2d) {
      uVar9 = lVar7 >> 1;
      length = uVar9 - 1;
      if (XVar2 == L'[') {
        bVar3 = isWellFormedIPv6Reference(addrString,length);
        return bVar3;
      }
      if (addrString[uVar9 - 2] != L'-') {
        lVar7 = 0;
        do {
          psVar1 = (short *)((long)addrString + lVar7);
          lVar7 = lVar7 + 2;
        } while (*psVar1 != 0);
        iVar5 = XMLString::lastIndexOf(L'.',addrString,(lVar7 >> 1) - 1);
        if (length == (long)(iVar5 + 1)) {
          iVar6 = (*manager->_vptr_MemoryManager[3])(manager,length * 2);
          targetStr = (XMLCh *)CONCAT44(extraout_var,iVar6);
          toSearchLen = 0;
          XMLString::subString(targetStr,addrString,0,(long)iVar5,manager);
          if (targetStr != (XMLCh *)0x0) {
            lVar7 = 0;
            do {
              psVar1 = (short *)((long)targetStr + lVar7);
              lVar7 = lVar7 + 2;
            } while (*psVar1 != 0);
            toSearchLen = (lVar7 >> 1) - 1;
          }
          iVar5 = XMLString::lastIndexOf(L'.',targetStr,toSearchLen);
          (*manager->_vptr_MemoryManager[4])(manager,targetStr);
          bVar3 = XMLString::isDigit(addrString[(long)iVar5 + 1]);
          if (bVar3) {
            return false;
          }
        }
        bVar3 = XMLString::isDigit(addrString[(long)iVar5 + 1]);
        if (bVar3) {
          bVar3 = isWellFormedIPv4Address(addrString,length);
          return bVar3;
        }
        if (length < 0x100) {
          bVar3 = length == 0;
          if (bVar3) {
            return bVar3;
          }
          uVar8 = 0;
          uVar10 = 1;
          do {
            if (addrString[uVar10 - 1] == L'.') {
              if ((uVar10 != 1) && (bVar4 = XMLString::isAlphaNum(addrString[uVar10 - 2]), !bVar4))
              {
                return bVar3;
              }
              uVar8 = 0;
              if ((uVar10 < length) &&
                 (bVar4 = XMLString::isAlphaNum(addrString[uVar10]), uVar8 = 0, !bVar4)) {
                return bVar3;
              }
            }
            else {
              bVar4 = XMLString::isAlphaNum(addrString[uVar10 - 1]);
              if ((!bVar4) && (addrString[uVar10 - 1] != L'-')) {
                return bVar3;
              }
              uVar8 = uVar8 + 1;
              if (0x3f < uVar8) {
                return bVar3;
              }
            }
            bVar3 = length <= uVar10;
            uVar10 = uVar10 + 1;
            if (uVar9 == uVar10) {
              return bVar3;
            }
          } while( true );
        }
      }
    }
  }
  return false;
}

Assistant:

bool XMLUri::isWellFormedAddress(const XMLCh* const addrString
                                 , MemoryManager* const manager)
{
    // Check that we have a non-zero length string.
    if (!addrString || !*addrString)
        return false;

    // Get address length.
    XMLSize_t addrStrLen = XMLString::stringLen(addrString);

    // Check if the host is a valid IPv6reference.
    if (*addrString == chOpenSquare)
    {
        return isWellFormedIPv6Reference(addrString, addrStrLen);
    }

    //
    // Cannot start with a '.', '-', or end with a '-'.
    //
    if (*addrString == chPeriod ||
        *addrString == chDash ||
        addrString[addrStrLen-1] == chDash)
        return false;

    // rightmost domain label starting with digit indicates IP address
    // since top level domain label can only start with an alpha
    // see RFC 2396 Section 3.2.2

    int lastPeriodPos = XMLString::lastIndexOf(addrString, chPeriod);

    // if the string ends with "."
    // get the second last "."
    if (XMLSize_t(lastPeriodPos + 1) == addrStrLen)
    {
        XMLCh* tmp2 = (XMLCh*) manager->allocate
        (
            addrStrLen * sizeof(XMLCh)
        );//new XMLCh[addrStrLen];
        XMLString::subString(tmp2, addrString, 0, lastPeriodPos, manager);
        lastPeriodPos = XMLString::lastIndexOf(tmp2, chPeriod);
        manager->deallocate(tmp2);//delete [] tmp2;

        if ( XMLString::isDigit(addrString[lastPeriodPos + 1]))
			return false;
    }

    if (XMLString::isDigit(addrString[lastPeriodPos + 1]))
    {
        return isWellFormedIPv4Address(addrString, addrStrLen);
    } // end of IPv4address
    else
    {
        //
        //  hostname      = *( domainlabel "." ) toplabel [ "." ]
        //  domainlabel   = alphanum | alphanum *( alphanum | "-" ) alphanum
        //  toplabel      = alpha | alpha *( alphanum | "-" ) alphanum

        // RFC 2396 states that hostnames take the form described in
        // RFC 1034 (Section 3) and RFC 1123 (Section 2.1). According
        // to RFC 1034, hostnames are limited to 255 characters.
        if (addrStrLen > 255) {
            return false;
        }

        unsigned int labelCharCount = 0;

        // domain labels can contain alphanumerics and '-"
        // but must start and end with an alphanumeric
        for (XMLSize_t i = 0; i < addrStrLen; i++)
        {
            if (addrString[i] == chPeriod)
            {
              if (((i > 0)  &&
                   (!XMLString::isAlphaNum(addrString[i-1]))) ||
                  ((i + 1 < addrStrLen) &&
                   (!XMLString::isAlphaNum(addrString[i+1])))  )
                {
                    return false;
                }
                labelCharCount = 0;
            }
            else if (!XMLString::isAlphaNum(addrString[i]) &&
                      addrString[i] != chDash)
            {
                return false;
            }
            // RFC 1034: Labels must be 63 characters or less.
            else if (++labelCharCount > 63) {
                return false;
            }
        } //for
    }

    return true;
}